

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecPeformDec2(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  bool local_1209;
  int local_1208;
  int local_1204;
  int iLibObjBest;
  int iLibObj;
  int GainBest;
  int GainThis;
  int AreaNew;
  int AreaThis;
  int iBest;
  int Prev;
  int RetValue;
  int i;
  int nDecs;
  int fVeryVerbose;
  int pAssump [1000];
  int nSupp [4];
  int pSupp [4] [16];
  word Masks [2] [8];
  word uTruth [4] [4];
  Abc_Obj_t *pObj_local;
  Sfm_Dec_t *p_local;
  
  local_1209 = true;
  if (p->pPars->fPrintDecs == 0) {
    local_1209 = p->pPars->fVeryVerbose != 0;
  }
  i = (int)local_1209;
  RetValue = Abc_MaxInt(p->pPars->nDecMax,1);
  AreaThis = 0;
  AreaNew = -1;
  iLibObjBest = -1;
  local_1208 = -1;
  if (p->pPars->fArea != 1) {
    __assert_fail("p->pPars->fArea == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x454,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  if (i != 0) {
    printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
  }
  if (4 < p->pPars->nDecMax) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x459,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  Vec_IntClear(&p->vObjDec);
  Prev = 0;
  do {
    if (RetValue <= Prev) {
      Sfm_ObjSetdownSimInfo(pObj);
      if (AreaNew == -1) {
        if (i != 0) {
          printf("Best  : NO DEC.\n");
        }
        p->nNoDecs = p->nNoDecs + 1;
        p_local._4_4_ = -2;
      }
      else {
        if (i != 0) {
          printf("Best %d: %d  ",(ulong)(uint)AreaNew,(ulong)(uint)pAssump[(long)AreaNew + 0x3e6]);
        }
        if (i != 0) {
          Dau_DsdPrintFromTruth(uTruth[(long)AreaNew + -1] + 3,pAssump[(long)AreaNew + 0x3e6]);
        }
        if (local_1208 < 0) {
          __assert_fail("iLibObjBest >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4ad,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        iBest = Sfm_LibImplementGatesArea
                          (p->pLib,pSupp[(long)AreaNew + -1] + 0xe,pAssump[(long)AreaNew + 0x3e6],
                           local_1208,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < pAssump[(long)AreaNew + 0x3e6]) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4af,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[pAssump[(long)AreaNew + 0x3e6]] =
             p->nLuckySizes[pAssump[(long)AreaNew + 0x3e6]] + 1;
        if (2 < iBest) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4b1,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckyGates[iBest] = p->nLuckyGates[iBest] + 1;
        p_local._4_4_ = 1;
      }
      return p_local._4_4_;
    }
    iVar1 = Vec_IntSize(&p->vObjDec);
    if (AreaThis < iVar1) {
      Vec_IntShrink(&p->vObjDec,AreaThis);
    }
    iVar1 = Vec_IntSize(&p->vObjDec);
    AreaThis = iVar1 + 1;
    Abc_TtMask((word *)(pSupp[3] + 0xe),8,p->nPats[0]);
    Abc_TtMask(Masks[0] + 7,8,p->nPats[1]);
    iVar1 = Sfm_DecPeformDec_rec
                      (p,uTruth[(long)Prev + -1] + 3,pSupp[(long)Prev + -1] + 0xe,&nDecs,0,
                       (word (*) [8])(pSupp[3] + 0xe),1,0);
    pAssump[(long)Prev + 0x3e6] = iVar1;
    if (pAssump[(long)Prev + 0x3e6] == -2) {
      if (i != 0) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",(ulong)(uint)Prev,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (i != 0) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",(ulong)(uint)Prev,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      }
      if (i != 0) {
        Dau_DsdPrintFromTruth(uTruth[(long)Prev + -1] + 3,pAssump[(long)Prev + 0x3e6]);
      }
      if (pAssump[(long)Prev + 0x3e6] < 2) {
        p->nSuppVars = pAssump[(long)Prev + 0x3e6];
        Abc_TtCopy(p->Copy,uTruth[(long)Prev + -1] + 3,4,0);
        iBest = Sfm_LibImplementSimple
                          (p->pLib,uTruth[(long)Prev + -1] + 3,pSupp[(long)Prev + -1] + 0xe,
                           pAssump[(long)Prev + 0x3e6],&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < pAssump[(long)Prev + 0x3e6]) {
          __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x475,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[pAssump[(long)Prev + 0x3e6]] =
             p->nLuckySizes[pAssump[(long)Prev + 0x3e6]] + 1;
        if (iBest < 3) {
          p->nLuckyGates[iBest] = p->nLuckyGates[iBest] + 1;
          return iBest;
        }
        __assert_fail("RetValue <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x477,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
      }
      p->nSuppVars = pAssump[(long)Prev + 0x3e6];
      Abc_TtCopy(p->Copy,uTruth[(long)Prev + -1] + 3,4,0);
      GainBest = Sfm_LibFindAreaMatch
                           (p->pLib,uTruth[(long)Prev + -1] + 3,pAssump[(long)Prev + 0x3e6],
                            &local_1204);
      if (GainBest != -1) {
        Sfm_DecPrepareVec(&p->vObjMap,pSupp[(long)Prev + -1] + 0xe,pAssump[(long)Prev + 0x3e6],
                          &p->vGateCut);
        GainThis = Sfm_DecMffcAreaReal(pObj,&p->vGateCut,(Vec_Int_t *)0x0);
        if (GainThis < p->AreaMffc) {
          __assert_fail("p->AreaMffc <= AreaThis",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x492,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        if (p->pPars->fZeroCost == 0) {
          if (GainBest < GainThis) goto LAB_0065512f;
        }
        else if (GainBest <= GainThis) {
LAB_0065512f:
          iLibObj = GainThis - GainBest;
          if (iLibObj < 0) {
            __assert_fail("GainThis >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                          ,0x497,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
          }
          if (iLibObjBest < iLibObj) {
            local_1208 = local_1204;
            AreaNew = Prev;
            iLibObjBest = iLibObj;
          }
        }
      }
    }
    Prev = Prev + 1;
  } while( true );
}

Assistant:

int Sfm_DecPeformDec2( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    //int fNeedInv, AreaGainInv = Sfm_DecComputeFlipInvGain(p, pObj, &fNeedInv);
    int i, RetValue, Prev = 0, iBest = -1, AreaThis, AreaNew;//, AreaNewInv;
    int GainThis, GainBest = -1, iLibObj, iLibObjBest = -1; 
    assert( p->pPars->fArea == 1 );
//printf( "AreaGainInv = %8.2f  ", Scl_Int2Flt(AreaGainInv) );
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            //printf( "\n" );
            return RetValue;
        }

        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        AreaNew = Sfm_LibFindAreaMatch( p->pLib, uTruth[i], nSupp[i], &iLibObj );
/*
        uTruth[i][0] = ~uTruth[i][0];
        AreaNewInv = Sfm_LibFindAreaMatch( p->pLib, uTruth[i], nSupp[i], NULL );
        uTruth[i][0] = ~uTruth[i][0];

        if ( AreaNew > 0 && AreaNewInv > 0 && AreaNew - AreaNewInv + AreaGainInv > 0 )
            printf( "AreaNew = %8.2f   AreaNewInv = %8.2f   Gain = %8.2f   Total = %8.2f\n", 
                Scl_Int2Flt(AreaNew), Scl_Int2Flt(AreaNewInv), Scl_Int2Flt(AreaNew - AreaNewInv), Scl_Int2Flt(AreaNew - AreaNewInv + AreaGainInv) );
        else
            printf( "\n" );
*/
        if ( AreaNew == -1 )
            continue;


        // compute area savings
        Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vGateCut );
        AreaThis = Sfm_DecMffcAreaReal(pObj, &p->vGateCut, NULL);
        assert( p->AreaMffc <= AreaThis );
        if ( p->pPars->fZeroCost ? (AreaNew > AreaThis) : (AreaNew >= AreaThis) )
            continue;
        // find the best gain
        GainThis = AreaThis - AreaNew;
        assert( GainThis >= 0 );
        if ( GainBest < GainThis )
        {
            GainBest    = GainThis;
            iLibObjBest = iLibObj;
            iBest       = i;
        }
    }
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        //printf( "\n" );
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
    if ( fVeryVerbose )
      Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    // implement
    assert( iLibObjBest >= 0 );
    RetValue = Sfm_LibImplementGatesArea( p->pLib, pSupp[iBest], nSupp[iBest], iLibObjBest, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    return 1;
}